

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_try(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTcParser *this_00;
  CTPNStmSwitch *this_01;
  long lVar3;
  CTcToken *pCVar4;
  char *pcVar5;
  CTcSymLocal *var_00;
  CTPNStmFinallyBase *pCVar6;
  CTcTokFileDesc *pCVar7;
  CTPNStmEnclosing *stm;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *in_RSI;
  CTcParser *in_RDI;
  CTPNStmEnclosing *old_enclosing_1;
  tcprs_scope_t scope_data_1;
  CTPNStm *fin_body;
  CTPNStmFinally *fin_stm;
  CTcSymLocal *var;
  tcprs_scope_t scope_data;
  CTPNStmCatch *catch_stm;
  CTPNStm *catch_body;
  int catch_has_err;
  CTPNStm *body_stm;
  CTPNStmEnclosing *old_enclosing;
  CTPNStmTry *try_stm;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  CTcTokenizer *in_stack_fffffffffffffed8;
  CTPNStmFinallyBase *this_02;
  CTcParser *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  textchar_t *in_stack_ffffffffffffff00;
  CTcPrsSymtab *in_stack_ffffffffffffff08;
  CTcTokFileDesc *in_stack_ffffffffffffff40;
  CTPNStmSwitch *in_stack_ffffffffffffff48;
  tcprs_scope_t local_98;
  CTPNStm *local_80;
  tcprs_scope_t local_68;
  CTPNStmSwitch *local_50;
  CTPNStm *local_48;
  int local_40;
  CTPNStm *local_30;
  CTPNStmEnclosing *local_28;
  CTcParser *local_20;
  int *local_18;
  CTcParser *local_8;
  
  local_18 = in_RSI;
  this_00 = (CTcParser *)CTcPrsAllocObj::operator_new(0x2bd581);
  CTPNStmTry::CTPNStmTry
            ((CTPNStmTry *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (CTPNStmEnclosing *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_20 = this_00;
  local_28 = set_enclosing_stm(in_RDI,(CTPNStmEnclosing *)this_00);
  CTcTokenizer::next(in_stack_fffffffffffffed8);
  local_30 = parse_stm(this_00,(int *)in_RDI,in_stack_ffffffffffffff48,
                       (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  set_enclosing_stm(in_RDI,local_28);
  if (*local_18 == 0) {
    CTPNStmTryBase::set_body_stm((CTPNStmTryBase *)local_20,local_30);
    while( true ) {
      iVar2 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bd686);
      if (tVar1 != TOKT_CATCH) break;
      enter_scope(in_RDI,&local_68);
      create_scope_local_symtab(in_stack_fffffffffffffee0);
      this_01 = (CTPNStmSwitch *)CTcPrsAllocObj::operator_new(0x2bd6bb);
      CTPNStmCatch::CTPNStmCatch
                ((CTPNStmCatch *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      in_stack_ffffffffffffff48 = this_01;
      local_50 = this_01;
      in_stack_ffffffffffffff40 = CTcTokenizer::get_last_desc(G_tok);
      lVar3 = CTcTokenizer::get_last_linenum(G_tok);
      CTPNStmBase::set_source_pos((CTPNStmBase *)this_01,in_stack_ffffffffffffff40,lVar3);
      local_40 = 0;
      tVar1 = CTcTokenizer::next(in_stack_fffffffffffffed8);
      if (tVar1 == TOKT_LPAR) {
        CTcTokenizer::next(in_stack_fffffffffffffed8);
      }
      else {
        CTcTokenizer::log_error_curtok
                  ((CTcTokenizer *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffecc);
      }
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bd7a0);
      if (tVar1 == TOKT_SYM) {
        CTcTokenizer::getcur(G_tok);
        CTPNStmCatchBase::set_exc_class
                  ((CTPNStmCatchBase *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                   ,(CTcToken *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        CTcTokenizer::next(in_stack_fffffffffffffed8);
      }
      else {
        CTcTokenizer::log_error_curtok
                  ((CTcTokenizer *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffecc);
        tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bd802);
        if (tVar1 != TOKT_RPAR) {
          CTcTokenizer::next(in_stack_fffffffffffffed8);
        }
        local_40 = 1;
      }
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bd830);
      if (tVar1 == TOKT_SYM) {
        pCVar4 = CTcTokenizer::getcur(G_tok);
        pcVar5 = CTcToken::get_text(pCVar4);
        iVar2 = (int)pcVar5;
        pCVar4 = CTcTokenizer::getcur(G_tok);
        CTcToken::get_text_len(pCVar4);
        alloc_local(in_RDI);
        in_stack_fffffffffffffec8 = 1;
        var_00 = CTcPrsSymtab::add_local
                           (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                            (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                            (int)in_stack_fffffffffffffef0,
                            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),iVar2);
        if (local_40 == 0) {
          CTPNStmCatchBase::set_exc_var((CTPNStmCatchBase *)local_50,var_00);
        }
        CTcTokenizer::next(in_stack_fffffffffffffed8);
      }
      else {
        CTcTokenizer::log_error_curtok
                  ((CTcTokenizer *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffecc);
        tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bd913);
        if (tVar1 != TOKT_RPAR) {
          CTcTokenizer::next(in_stack_fffffffffffffed8);
        }
        local_40 = 1;
      }
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bd941);
      if (tVar1 == TOKT_RPAR) {
        CTcTokenizer::next(in_stack_fffffffffffffed8);
      }
      else {
        CTcTokenizer::log_error_curtok
                  ((CTcTokenizer *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffecc);
      }
      local_48 = parse_stm(this_00,(int *)in_RDI,in_stack_ffffffffffffff48,
                           (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      leave_scope(in_RDI,&local_68);
      if (*local_18 != 0) {
        return (CTPNStm *)0x0;
      }
      if (local_40 == 0) {
        CTPNStmCatchBase::set_body((CTPNStmCatchBase *)local_50,local_48);
        CTPNStmCatchBase::set_symtab((CTPNStmCatchBase *)local_50,in_RDI->local_symtab_);
        CTPNStmTryBase::add_catch
                  ((CTPNStmTryBase *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (CTPNStmCatch *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      }
    }
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bda28);
    if (tVar1 == TOKT_FINALLY) {
      enter_scope(in_RDI,&local_98);
      pCVar6 = (CTPNStmFinallyBase *)CTcPrsAllocObj::operator_new(0x2bda50);
      alloc_local(in_RDI);
      alloc_local(in_RDI);
      CTPNStmFinally::CTPNStmFinally
                ((CTPNStmFinally *)in_stack_fffffffffffffee0,
                 (CTPNStmEnclosing *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                 in_stack_fffffffffffffed0);
      this_02 = pCVar6;
      pCVar7 = CTcTokenizer::get_last_desc(G_tok);
      lVar3 = CTcTokenizer::get_last_linenum(G_tok);
      CTPNStmBase::set_source_pos((CTPNStmBase *)pCVar6,pCVar7,lVar3);
      CTcTokenizer::next(in_stack_fffffffffffffed8);
      stm = set_enclosing_stm(in_RDI,&this_02->super_CTPNStmEnclosing);
      local_80 = parse_stm(this_00,(int *)in_RDI,in_stack_ffffffffffffff48,iVar2);
      pCVar6 = this_02;
      if (local_80 != (CTPNStm *)0x0) {
        iVar2 = (*(local_80->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase.
                  _vptr_CTcPrsNodeBase[0x1a])();
        pCVar7 = (CTcTokFileDesc *)CONCAT44(extraout_var,iVar2);
        iVar2 = (*(local_80->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase.
                  _vptr_CTcPrsNodeBase[0x1b])();
        CTPNStmFinallyBase::set_end_pos(this_02,pCVar7,CONCAT44(extraout_var_00,iVar2));
      }
      set_enclosing_stm(in_RDI,stm);
      leave_scope(in_RDI,&local_98);
      if (*local_18 != 0) {
        return (CTPNStm *)0x0;
      }
      CTPNStmFinallyBase::set_body(pCVar6,local_80);
      CTPNStmTryBase::set_finally((CTPNStmTryBase *)local_20,(CTPNStmFinally *)pCVar6);
    }
    iVar2 = CTPNStmTryBase::has_catch_or_finally((CTPNStmTryBase *)local_20);
    if (iVar2 == 0) {
      CTPNStmBase::log_error((CTPNStmBase *)local_20,0x2b4f);
    }
    local_8 = local_20;
  }
  else {
    local_8 = (CTcParser *)0x0;
  }
  return (CTPNStm *)local_8;
}

Assistant:

CTPNStm *CTcParser::parse_try(int *err)
{
    CTPNStmTry *try_stm;
    CTPNStmEnclosing *old_enclosing;
    CTPNStm *body_stm;

    /* create the 'try' statement node */
    try_stm = new CTPNStmTry(enclosing_stm_);

    /* 
     *   the 'try' is the enclosing statement for the duration of its
     *   protected code block 
     */
    old_enclosing = set_enclosing_stm(try_stm);
    
    /* skip the 'try' */
    G_tok->next();

    /* parse the body of the 'try' block */
    body_stm = parse_stm(err, 0, FALSE);

    /* restore the previous enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* if parsing the body failed, stop now */
    if (*err)
        return 0;

    /* add the body to the 'try' */
    try_stm->set_body_stm(body_stm);

    /* 
     *   check for 'catch' clauses - there could be several, so keep going
     *   until we stop seeing 'catch' keywords 
     */
    while (G_tok->cur() == TOKT_CATCH)
    {
        int catch_has_err;
        CTPNStm *catch_body;
        CTPNStmCatch *catch_stm;
        tcprs_scope_t scope_data;

        /* create a local scope for the 'catch' clause */
        enter_scope(&scope_data);
        create_scope_local_symtab();
        
        /* create the 'catch' statement node */
        catch_stm = new CTPNStmCatch();

        /* 
         *   set the 'catch' clause's source position independently of the
         *   overall 'try' statement, so that the debugger can track entry
         *   into this clause 
         */
        catch_stm->set_source_pos(G_tok->get_last_desc(),
                                  G_tok->get_last_linenum());

        /* presume we'll parse this successfully */
        catch_has_err = FALSE;
            
        /* skip the 'catch' keyword and check for the left paren */
        if (G_tok->next() == TOKT_LPAR)
        {
            /* skip the paren */
            G_tok->next();
        }
        else
        {
            /* log the error */
            G_tok->log_error_curtok(TCERR_REQ_CATCH_LPAR);
        }

        /* get the exception class token */
        if (G_tok->cur() == TOKT_SYM)
        {
            /* set the class name in the 'catch' clause */
            catch_stm->set_exc_class(G_tok->getcur());

            /* move on */
            G_tok->next();
        }
        else
        {
            /* flag the problem */
            G_tok->log_error_curtok(TCERR_REQ_CATCH_CLASS);

            /* unless this is a close paren, skip the errant token */
            if (G_tok->cur() != TOKT_RPAR)
                G_tok->next();

            /* note the error */
            catch_has_err = TRUE;
        }

        /* get the variable name token */
        if (G_tok->cur() == TOKT_SYM)
        {
            CTcSymLocal *var;
            
            /* 
             *   create the local variable - note that this variable is
             *   implicitly assigned when the 'catch' clause is entered, so
             *   mark it as initially assigned; we don't care if the
             *   variable is ever used, so also mark it as used 
             */
            var = local_symtab_->add_local(G_tok->getcur()->get_text(),
                                           G_tok->getcur()->get_text_len(),
                                           alloc_local(),
                                           FALSE, TRUE, TRUE);
            
            /* set the variable in the 'catch' clause */
            if (!catch_has_err)
                catch_stm->set_exc_var(var);

            /* move on */
            G_tok->next();
        }
        else
        {
            /* flag the problem */
            G_tok->log_error_curtok(TCERR_REQ_CATCH_VAR);

            /* unless this is a close paren, skip the errant token */
            if (G_tok->cur() != TOKT_RPAR)
                G_tok->next();

            /* note the error */
            catch_has_err = TRUE;
        }

        /* check for the close paren */
        if (G_tok->cur() == TOKT_RPAR)
        {
            /* skip the paren */
            G_tok->next();
        }
        else
        {
            /* 
             *   log the error and continue, assuming that the paren is
             *   simply missing and things are otherwise okay 
             */
            G_tok->log_error_curtok(TCERR_REQ_CATCH_RPAR);
        }

        /* 
         *   parse the 'catch' statement block - we've already established
         *   a special scope for the 'catch' block, so don't start a new
         *   scope if the block contains a compound statement 
         */
        catch_body = parse_stm(err, 0, TRUE);

        /* leave the special 'catch' scope */
        leave_scope(&scope_data);

        /* if the statement block failed, give up now */
        if (*err)
            return 0;

        /* add the 'catch' clause to the 'try' if we were successful */
        if (!catch_has_err)
        {
            /* set the 'catch' node's body */
            catch_stm->set_body(catch_body);

            /* set the local scope in the 'catch' */
            catch_stm->set_symtab(local_symtab_);
            
            /* add the 'catch' to the 'try' */
            try_stm->add_catch(catch_stm);
        }
    }

    /* check for a 'finally' clause */
    if (G_tok->cur() == TOKT_FINALLY)
    {
        CTPNStmFinally *fin_stm;
        CTPNStm *fin_body;
        tcprs_scope_t scope_data;
        CTPNStmEnclosing *old_enclosing;

        /* 
         *   the locals we allocate for the 'finally' are in the finally's
         *   own scope - the slots can be reused later 
         */
        enter_scope(&scope_data);

        /* create the 'finally' node */
        fin_stm = new CTPNStmFinally(enclosing_stm_,
                                     alloc_local(), alloc_local());

        /* 
         *   set the 'finally' clause's source position - we want this
         *   clause to have its own source position independent of the
         *   'try' statement of which it is a part, so that the debugger
         *   can keep track of entry into this clause's generated code 
         */
        fin_stm->set_source_pos(G_tok->get_last_desc(),
                                G_tok->get_last_linenum());

        /* skip the 'finally' keyword */
        G_tok->next();

        /* set the 'finally' to enclose its body */
        old_enclosing = set_enclosing_stm(fin_stm);

        /* parse the 'finally' statement block */
        fin_body = parse_stm(err, 0, FALSE);

        /* set the 'finally' block's closing position, if present */
        if (fin_body != 0)
        {
            fin_stm->set_end_pos(
                fin_body->get_end_desc(), fin_body->get_end_linenum());
        }

        /* restore the enclosing statement */
        set_enclosing_stm(old_enclosing);

        /* we're done with the special scope */
        leave_scope(&scope_data);

        /* if that failed, give up now */
        if (*err)
            return 0;

        /* set the 'finally' node's body */
        fin_stm->set_body(fin_body);

        /* add the 'finally' to the 'try' */
        try_stm->set_finally(fin_stm);
    }

    /* make sure we have at least one 'catch' or 'finally' clause */
    if (!try_stm->has_catch_or_finally())
        try_stm->log_error(TCERR_TRY_WITHOUT_CATCH);

    /* return the 'try' statement node */
    return try_stm;
}